

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

int Constant::Util::getint(char **p)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar5;
  byte *pbVar4;
  
  pbVar4 = (byte *)*p;
  while( true ) {
    pbVar3 = pbVar4 + 1;
    uVar5 = (uint)(char)*pbVar4;
    if (0xfffffff5 < uVar5 - 0x3a) break;
    *p = (char *)pbVar3;
    pbVar4 = pbVar3;
  }
  iVar2 = 0;
  while ((int)(char)uVar5 - 0x30U < 10) {
    iVar2 = iVar2 * 10 + (int)(char)uVar5 + -0x30;
    *p = (char *)pbVar3;
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    uVar5 = (uint)bVar1;
  }
  return iVar2;
}

Assistant:

int Constant::Util::getint(char *&p) {
    while (!isdigit(*p))
        p++;
    int ret = 0;
    while (isdigit(*p)) {
        ret = 10*ret + *p - '0';
        p++;
    }
    return ret;
}